

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O1

unsigned_short
anon_unknown.dwarf_90f3::parse<unsigned_short>(char *str,unsigned_short min,unsigned_short max)

{
  int64_t iVar1;
  
  iVar1 = util::parse_bounded(str,0,0xffff);
  return (unsigned_short)iVar1;
}

Assistant:

T parse(const char* str, T min, T max)
	{
		T value = T();
		try
		{
			value = static_cast<T>(util::parse_bounded(str, min, max));
		}
		catch (std::exception& e)
		{
			util::fatal("Invalid argument %s (%s)", str, e.what());
		}
		return value;
	}